

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O1

int ffppr(fitsfile *fptr,int datatype,LONGLONG firstelem,LONGLONG nelem,void *array,int *status)

{
  if (0 < *status) {
    return *status;
  }
  if (datatype < 0x28) {
    if (datatype < 0x15) {
      if (datatype == 0xb) {
        ffpprb(fptr,1,firstelem,nelem,(uchar *)array,status);
        goto LAB_00193f94;
      }
      if (datatype == 0xc) {
        ffpprsb(fptr,1,firstelem,nelem,(char *)array,status);
        goto LAB_00193f94;
      }
      if (datatype == 0x14) {
        ffpprui(fptr,1,firstelem,nelem,(unsigned_short *)array,status);
        goto LAB_00193f94;
      }
    }
    else {
      if (datatype == 0x15) {
        ffppri(fptr,1,firstelem,nelem,(short *)array,status);
        goto LAB_00193f94;
      }
      if (datatype == 0x1e) {
        ffppruk(fptr,1,firstelem,nelem,(uint *)array,status);
        goto LAB_00193f94;
      }
      if (datatype == 0x1f) {
        ffpprk(fptr,1,firstelem,nelem,(int *)array,status);
        goto LAB_00193f94;
      }
    }
  }
  else if (datatype < 0x50) {
    if (datatype == 0x28) {
      ffppruj(fptr,1,firstelem,nelem,(unsigned_long *)array,status);
      goto LAB_00193f94;
    }
    if (datatype == 0x29) {
      ffpprj(fptr,1,firstelem,nelem,(long *)array,status);
      goto LAB_00193f94;
    }
    if (datatype == 0x2a) {
      ffppre(fptr,1,firstelem,nelem,(float *)array,status);
      goto LAB_00193f94;
    }
  }
  else {
    if (datatype == 0x50) {
      ffpprujj(fptr,1,firstelem,nelem,(ULONGLONG *)array,status);
      goto LAB_00193f94;
    }
    if (datatype == 0x51) {
      ffpprjj(fptr,1,firstelem,nelem,(LONGLONG *)array,status);
      goto LAB_00193f94;
    }
    if (datatype == 0x52) {
      ffpprd(fptr,1,firstelem,nelem,(double *)array,status);
      goto LAB_00193f94;
    }
  }
  *status = 0x19a;
LAB_00193f94:
  return *status;
}

Assistant:

int ffppr(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            void  *array,    /* I - array of values that are written        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).

*/
{
    long group = 1;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TBYTE)
    {
      ffpprb(fptr, group, firstelem, nelem, (unsigned char *) array, status);
    }
    else if (datatype == TSBYTE)
    {
      ffpprsb(fptr, group, firstelem, nelem, (signed char *) array, status);
    }
    else if (datatype == TUSHORT)
    {
      ffpprui(fptr, group, firstelem, nelem, (unsigned short *) array,
              status);
    }
    else if (datatype == TSHORT)
    {
      ffppri(fptr, group, firstelem, nelem, (short *) array, status);
    }
    else if (datatype == TUINT)
    {
      ffppruk(fptr, group, firstelem, nelem, (unsigned int *) array, status);
    }
    else if (datatype == TINT)
    {
      ffpprk(fptr, group, firstelem, nelem, (int *) array, status);
    }
    else if (datatype == TULONG)
    {
      ffppruj(fptr, group, firstelem, nelem, (unsigned long *) array, status);
    }
    else if (datatype == TLONG)
    {
      ffpprj(fptr, group, firstelem, nelem, (long *) array, status);
    }
    else if (datatype == TULONGLONG)
    {
      ffpprujj(fptr, group, firstelem, nelem, (ULONGLONG *) array, status);
    }
    else if (datatype == TLONGLONG)
    {
      ffpprjj(fptr, group, firstelem, nelem, (LONGLONG *) array, status);
    }
    else if (datatype == TFLOAT)
    {
      ffppre(fptr, group, firstelem, nelem, (float *) array, status);
    }
    else if (datatype == TDOUBLE)
    {
      ffpprd(fptr, group, firstelem, nelem, (double *) array, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}